

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O3

Vector<int,_4> tcu::sampleTextureBorder<int>(TextureFormat *format,Sampler *sampler)

{
  TextureChannelClass TVar1;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar2;
  Vector<int,_4> *res;
  ChannelOrder CVar3;
  ChannelType CVar4;
  ChannelOrder CVar5;
  ChannelType CVar6;
  UVec4 UVar7;
  IVec4 IVar8;
  Vector<int,_4> VVar9;
  TextureFormat local_38;
  float fStack_30;
  float fStack_2c;
  
  TVar1 = getTextureChannelClass(sampler->wrapT);
  switch(TVar1) {
  case TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
  case TEXTURECHANNELCLASS_FLOATING_POINT:
    getTextureBorderColorFloat(&local_38,(Sampler *)(ulong)sampler->wrapS);
    format->order = R;
    format->type = SNORM_INT8;
    format[1].order = R;
    format[1].type = SNORM_INT8;
    CVar3 = (ChannelOrder)(float)local_38.order;
    CVar4 = (ChannelType)(float)local_38.type;
    CVar5 = (ChannelOrder)fStack_30;
    CVar6 = (ChannelType)fStack_2c;
    uVar2 = extraout_RDX_00;
    break;
  case TEXTURECHANNELCLASS_SIGNED_INTEGER:
    IVar8 = getTextureBorderColorInt(format,(Sampler *)(ulong)sampler->wrapS);
    uVar2 = IVar8.m_data._8_8_;
    goto LAB_005e75e6;
  case TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
    UVar7 = getTextureBorderColorUint(format,(Sampler *)(ulong)sampler->wrapS);
    uVar2 = UVar7.m_data._8_8_;
    goto LAB_005e75e6;
  default:
    CVar3 = R;
    CVar4 = SNORM_INT8;
    CVar5 = R;
    CVar6 = SNORM_INT8;
    uVar2 = extraout_RDX;
  }
  format->order = CVar3;
  format->type = CVar4;
  format[1].order = CVar5;
  format[1].type = CVar6;
LAB_005e75e6:
  VVar9.m_data[2] = (int)uVar2;
  VVar9.m_data[3] = (int)((ulong)uVar2 >> 0x20);
  VVar9.m_data._0_8_ = format;
  return (Vector<int,_4>)VVar9.m_data;
}

Assistant:

tcu::Vector<ScalarType, 4> sampleTextureBorder (const TextureFormat& format, const Sampler& sampler)
{
	const tcu::TextureChannelClass channelClass = getTextureChannelClass(format.type);

	switch (channelClass)
	{
		case tcu::TEXTURECHANNELCLASS_FLOATING_POINT:
		case tcu::TEXTURECHANNELCLASS_SIGNED_FIXED_POINT:
		case tcu::TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT:
			return getTextureBorderColorFloat(format, sampler).cast<ScalarType>();

		case tcu::TEXTURECHANNELCLASS_SIGNED_INTEGER:
			return getTextureBorderColorInt(format, sampler).cast<ScalarType>();

		case tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER:
			return getTextureBorderColorUint(format, sampler).cast<ScalarType>();

		default:
			DE_ASSERT(false);
			return tcu::Vector<ScalarType, 4>();
	}
}